

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_source.cc
# Opt level: O2

int Nanomsg::open(char *__file,int __oflag,...)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  runtime_error *prVar5;
  char *pcVar6;
  int size;
  int fd;
  string local_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  iVar1 = nn_socket(1,0x21);
  fd = iVar1;
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_198,"nn_socket: ");
    iVar1 = nn_errno();
    pcVar6 = nn_strerror(iVar1);
    std::operator<<(poVar3,pcVar6);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_1c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = *(char **)(___oflag + 0xb8);
  iVar2 = nn_connect(iVar1,pcVar6);
  if (iVar2 < 0) {
    nn_close(iVar1);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_198,"nn_connect: ");
    iVar1 = nn_errno();
    pcVar4 = nn_strerror(iVar1);
    std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(local_198," (");
    poVar3 = std::operator<<(poVar3,pcVar6);
    std::operator<<(poVar3,")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_1c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  size = *(int *)(___oflag + 0xd8);
  if (0 < size) {
    iVar2 = nn_setsockopt(iVar1,0,2,&size,4);
    if (iVar2 < 0) {
      nn_close(iVar1);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_198,"nn_setsockopt: ");
      iVar1 = nn_errno();
      pcVar6 = nn_strerror(iVar1);
      std::operator<<(poVar3,pcVar6);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  iVar2 = nn_setsockopt(iVar1,0x21,1,"",0);
  if (-1 < iVar2) {
    std::make_unique<Nanomsg,int&>((int *)__file);
    return (int)__file;
  }
  nn_close(iVar1);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_198,"nn_setsockopt: ");
  iVar1 = nn_errno();
  pcVar4 = nn_strerror(iVar1);
  std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(local_198," (");
  poVar3 = std::operator<<(poVar3,pcVar6);
  std::operator<<(poVar3,")");
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,local_1c8);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Nanomsg> Nanomsg::open(const Config& config) {
  int rv;

  auto fd = nn_socket(AF_SP, NN_SUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  const char* url = config.nanomsg.connect.c_str();
  rv = nn_connect(fd, url);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_connect: " << nn_strerror(nn_errno());
    ss << " (" << url << ")";
    throw std::runtime_error(ss.str());
  }

  int size = config.nanomsg.receiveBuffer;
  if (size > 0) {
    rv = nn_setsockopt(fd, NN_SOL_SOCKET, NN_SNDBUF, &size, sizeof(size));
    if (rv < 0) {
      nn_close(fd);
      std::stringstream ss;
      ss << "nn_setsockopt: " << nn_strerror(nn_errno());
      throw std::runtime_error(ss.str());
    }
  }

  rv = nn_setsockopt(fd, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    ss << " (" << url << ")";
    throw std::runtime_error(ss.str());
  }

  return std::make_unique<Nanomsg>(fd);
}